

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O0

char * parse_id(char *p,char **save)

{
  char cVar1;
  ushort **ppuVar2;
  union_tag *puVar3;
  char **ppcVar4;
  bool bVar5;
  char *b;
  char **save_local;
  char *p_local;
  
  save_local = (char **)p;
  while (ppcVar4 = save_local, ppuVar2 = __ctype_b_loc(),
        ((*ppuVar2)[(int)*(char *)save_local] & 0x2000) != 0) {
    ppcVar4 = (char **)((long)save_local + 1);
    cVar1 = *(char *)save_local;
    save_local = ppcVar4;
    if (cVar1 == '\n') {
      rescan_lineno = rescan_lineno + 1;
    }
  }
  ppuVar2 = __ctype_b_loc();
  if ((((*ppuVar2)[(int)*(char *)save_local] & 0x400) == 0) && (*(char *)save_local != '_')) {
    p_local = (char *)0x0;
  }
  else {
    while( true ) {
      ppuVar2 = __ctype_b_loc();
      bVar5 = true;
      if ((((*ppuVar2)[(int)*(char *)save_local] & 8) == 0) &&
         (bVar5 = true, *(char *)save_local != '_')) {
        bVar5 = *(char *)save_local == '$';
      }
      if (!bVar5) break;
      save_local = (char **)((long)save_local + 1);
    }
    if (save != (char **)0x0) {
      puVar3 = cache_tag((char *)ppcVar4,(int)save_local - (int)ppcVar4);
      *save = puVar3->name;
    }
    p_local = (char *)save_local;
  }
  return p_local;
}

Assistant:

static char *parse_id(char *p, char **save)
{
char	*b;

    while (isspace(*p)) if (*p++ == '\n') rescan_lineno++;
    if (!isalpha(*p) && *p != '_') return 0;
    b = p;
    while (isalnum(*p) || *p == '_' || *p == '$') p++;
    if (save) {
	*save = cache_tag(b, p-b)->name; }
    return p;
}